

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::GetColumnOffset(int column_index)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  value_type *pvVar3;
  float x_offset;
  float t;
  ImGuiID column_id;
  ImGuiWindow *window;
  ImGuiContext *g;
  int column_index_local;
  
  pIVar1 = GImGui;
  pIVar2 = GetCurrentWindowRead();
  g._0_4_ = column_index;
  if (column_index < 0) {
    g._0_4_ = (pIVar2->DC).ColumnsCurrent;
  }
  if ((pIVar1->ActiveId == 0) || (pIVar1->ActiveId != (pIVar2->DC).ColumnsSetId + (int)g)) {
    if ((pIVar2->DC).ColumnsData.Size <= (int)g) {
      __assert_fail("column_index < window->DC.ColumnsData.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x244d,"float ImGui::GetColumnOffset(int)");
    }
    pvVar3 = ImVector<ImGuiColumnData>::operator[](&(pIVar2->DC).ColumnsData,(int)g);
    g._4_4_ = (float)(int)(pvVar3->OffsetNorm *
                           ((pIVar2->DC).ColumnsMaxX - (pIVar2->DC).ColumnsMinX) +
                          (pIVar2->DC).ColumnsMinX);
  }
  else {
    g._4_4_ = GetDraggedColumnOffset((int)g);
  }
  return g._4_4_;
}

Assistant:

float ImGui::GetColumnOffset(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindowRead();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    if (g.ActiveId)
    {
        const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
        if (g.ActiveId == column_id)
            return GetDraggedColumnOffset(column_index);
    }

    IM_ASSERT(column_index < window->DC.ColumnsData.Size);
    const float t = window->DC.ColumnsData[column_index].OffsetNorm;
    const float x_offset = window->DC.ColumnsMinX + t * (window->DC.ColumnsMaxX - window->DC.ColumnsMinX);
    return (float)(int)x_offset;
}